

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

Slice __thiscall leveldb::BlockBuilder::Finish(BlockBuilder *this)

{
  size_type sVar1;
  string *dst;
  long in_RDI;
  size_t i;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  string *in_stack_ffffffffffffffc0;
  undefined8 local_20;
  undefined1 local_10 [16];
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28));
    if (sVar1 <= local_20) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28),local_20);
    PutFixed32(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    local_20 = local_20 + 1;
  }
  dst = (string *)(in_RDI + 8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x28));
  PutFixed32(dst,in_stack_ffffffffffffffbc);
  *(undefined1 *)(in_RDI + 0x44) = 1;
  Slice::Slice((Slice *)dst,(string *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  return (Slice)local_10;
}

Assistant:

Slice BlockBuilder::Finish() {
  // Append restart array
  for (size_t i = 0; i < restarts_.size(); i++) {
    PutFixed32(&buffer_, restarts_[i]);
  }
  PutFixed32(&buffer_, (uint32_t)restarts_.size());
  finished_ = true;
  return Slice(buffer_);
}